

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall CServer::CServer(CServer *this)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  uchar *pMemory;
  
  (this->super_IServer).super_IInterface.m_pKernel = (IKernel *)0x0;
  (this->super_IServer).super_IInterface._vptr_IInterface = (_func_int **)&PTR__CServer_00163cb0;
  CSnapshotDelta::CSnapshotDelta(&this->m_SnapshotDelta);
  lVar3 = 0;
  do {
    lVar1 = lVar3 + 1;
    (this->m_IDPool).m_aIDs[lVar3].m_Next = (short)lVar1;
    (this->m_IDPool).m_aIDs[lVar3].m_State = 0;
    lVar3 = lVar1;
  } while (lVar1 != 0x4000);
  (this->m_IDPool).m_aIDs[0x3fff].m_Next = -1;
  (this->m_IDPool).m_FirstFree = 0;
  (this->m_IDPool).m_FirstTimed = -1;
  (this->m_IDPool).m_LastTimed = -1;
  (this->m_IDPool).m_Usage = 0;
  (this->m_IDPool).m_InUsage = 0;
  CNetBase::CNetBase(&(this->m_NetServer).super_CNetBase);
  pMemory = (this->m_NetServer).m_aSlots[0].m_Connection.m_Buffer.m_aBuffer;
  lVar3 = 0x21c600;
  do {
    CRingBufferBase::Init((CRingBufferBase *)(pMemory + -0x28),pMemory,0x8000,0);
    pMemory = pMemory + 0x8718;
    lVar3 = lVar3 + -0x8718;
  } while (lVar3 != 0);
  CNetRecvUnpacker::Clear(&(this->m_NetServer).m_RecvUnpacker);
  CNetTokenCache::CNetTokenCache(&(this->m_NetServer).m_TokenCache);
  CNetRecvUnpacker::Clear(&(this->m_Econ).m_NetConsole.m_RecvUnpacker);
  (this->m_ServerBan).super_CNetBan._vptr_CNetBan = (_func_int **)&PTR__CNetBan_00163d88;
  CDemoRecorder::CDemoRecorder(&this->m_DemoRecorder,&this->m_SnapshotDelta);
  CRegister::CRegister(&this->m_Register);
  this->m_pGameServer = (IGameServer *)0x0;
  (this->super_IServer).m_CurrentGameTick = 0;
  (this->super_IServer).m_TickSpeed = 0x32;
  this->m_RunServer = true;
  str_copy(this->m_aShutdownReason,"Server shutdown",0x80);
  this->m_pCurrentMapData = (uchar *)0x0;
  this->m_CurrentMapSize = 0;
  this->m_MapReload = false;
  this->m_pMapListHeap = (CHeap *)0x0;
  this->m_pLastMapEntry = (CMapListEntry *)0x0;
  *(undefined8 *)((long)&this->m_pLastMapEntry + 4) = 0;
  *(undefined8 *)((long)&this->m_pFirstMapEntry + 4) = 0;
  this->m_RconClientID = -1;
  this->m_RconAuthLevel = 2;
  this->m_RconPasswordSet = 0;
  this->m_GeneratedRconPassword = 0;
  lVar3 = 0;
  do {
    *(undefined4 *)((long)this->m_aClients[0].m_LatestInput.m_aData + lVar3 + -0x28) = 0;
    this->m_aClients[0].m_aName[lVar3] = '\0';
    this->m_aClients[0].m_aClan[lVar3] = '\0';
    pcVar2 = this->m_aClients[0].m_aClan + lVar3 + 0x37;
    pcVar2[0] = -1;
    pcVar2[1] = -1;
    pcVar2[2] = -1;
    pcVar2[3] = -1;
    CSnapshotStorage::Init
              ((CSnapshotStorage *)((long)this->m_aClients[0].m_LatestInput.m_aData + lVar3 + -0x10)
              );
    lVar3 = lVar3 + 0x195f0;
  } while (lVar3 != 0x657c00);
  (this->super_IServer).m_CurrentGameTick = 0;
  return;
}

Assistant:

CServer::CServer() : m_DemoRecorder(&m_SnapshotDelta)
{
	m_TickSpeed = SERVER_TICK_SPEED;

	m_pGameServer = 0;

	m_CurrentGameTick = 0;
	m_RunServer = true;

	str_copy(m_aShutdownReason, "Server shutdown", sizeof(m_aShutdownReason));

	m_pCurrentMapData = 0;
	m_CurrentMapSize = 0;

	m_NumMapEntries = 0;
	m_pFirstMapEntry = 0;
	m_pLastMapEntry = 0;
	m_pMapListHeap = 0;

	m_MapReload = false;

	m_RconClientID = IServer::RCON_CID_SERV;
	m_RconAuthLevel = AUTHED_ADMIN;

	m_RconPasswordSet = 0;
	m_GeneratedRconPassword = 0;

	Init();
}